

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O1

int set_vt_partitioning(AV1_COMP *cpi,MACROBLOCKD *xd,TileInfo *tile,void *data,BLOCK_SIZE bsize,
                       int mi_row,int mi_col,int64_t threshold,BLOCK_SIZE bsize_min,
                       PART_EVAL_STATUS force_split)

{
  byte bVar1;
  byte bVar2;
  BLOCK_SIZE BVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  BLOCK_SIZE bsize_00;
  uint uVar6;
  int iVar7;
  long *plVar8;
  uint uVar9;
  undefined7 in_register_00000081;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined4 uVar26;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint local_78;
  long alStack_60 [4];
  ulong local_40;
  ulong local_38;
  
  uVar15 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar15];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar15];
  uVar11 = (uint)bVar1;
  uVar12 = (uint)(bVar1 >> 1);
  uVar14 = (uint)(bVar2 >> 1);
  uVar6 = (uint)bVar2;
  uVar9 = uVar12;
  local_78 = uVar14;
  if (((cpi->common).seq_params)->sb_size == BLOCK_64X64) {
    uVar11 = uVar12 + 1;
    uVar9 = (bVar1 >> 2) + 1;
    if (tile->mi_col_end != (cpi->common).mi_params.mi_cols) {
      uVar11 = (uint)bVar1;
      uVar9 = uVar12;
    }
    uVar6 = (uint)bVar2;
    if (tile->mi_row_end == (cpi->common).mi_params.mi_rows) {
      uVar6 = uVar14 + 1;
      local_78 = (bVar2 >> 2) + 1;
    }
  }
  plVar8 = (long *)((long)data + 0x50);
  uVar20 = SUB84(plVar8,0);
  uVar26 = (undefined4)((ulong)plVar8 >> 0x20);
  switch(bsize) {
  case BLOCK_16X16:
    uVar15 = 0;
    uVar17 = 1;
    lVar10 = 0;
    auVar21._8_4_ = uVar20;
    auVar21._0_8_ = plVar8;
    auVar21._12_4_ = uVar26;
    do {
      alStack_60[lVar10] =
           (long)plVar8 + ((uVar15 >> 0x20) * 0x290 << 0x20) + (uVar15 & 0xffffffff) * 0x290;
      alStack_60[lVar10 + 1] =
           ((uVar17 >> 0x20) * 0x290 << 0x20) + (uVar17 & 0xffffffff) * 0x290 + auVar21._8_8_;
      lVar10 = lVar10 + 2;
      uVar15 = uVar15 + 2;
      uVar17 = uVar17 + 2;
    } while (lVar10 != 4);
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
switchD_0024f06b_caseD_7:
    lVar16 = 0;
    lVar18 = 1;
    lVar10 = 0;
    auVar19._8_4_ = uVar20;
    auVar19._0_8_ = plVar8;
    auVar19._12_4_ = uVar26;
    do {
      alStack_60[lVar10] = (long)(plVar8 + lVar16 * 2);
      alStack_60[lVar10 + 1] = lVar18 * 0x10 + auVar19._8_8_;
      lVar10 = lVar10 + 2;
      lVar16 = lVar16 + 2;
      lVar18 = lVar18 + 2;
    } while (lVar10 != 4);
    break;
  case BLOCK_32X32:
    uVar15 = 0;
    uVar17 = 1;
    lVar10 = 0;
    auVar25._8_4_ = uVar20;
    auVar25._0_8_ = plVar8;
    auVar25._12_4_ = uVar26;
    do {
      alStack_60[lVar10] =
           (long)plVar8 + ((uVar15 >> 0x20) * 0xa90 << 0x20) + (uVar15 & 0xffffffff) * 0xa90;
      alStack_60[lVar10 + 1] =
           ((uVar17 >> 0x20) * 0xa90 << 0x20) + (uVar17 & 0xffffffff) * 0xa90 + auVar25._8_8_;
      lVar10 = lVar10 + 2;
      uVar15 = uVar15 + 2;
      uVar17 = uVar17 + 2;
    } while (lVar10 != 4);
    break;
  case BLOCK_64X64:
    uVar15 = 0;
    uVar17 = 1;
    lVar10 = 0;
    auVar23._8_4_ = uVar20;
    auVar23._0_8_ = plVar8;
    auVar23._12_4_ = uVar26;
    do {
      alStack_60[lVar10] =
           (long)plVar8 + ((uVar15 >> 0x20) * 0x2a90 << 0x20) + (uVar15 & 0xffffffff) * 0x2a90;
      alStack_60[lVar10 + 1] =
           ((uVar17 >> 0x20) * 0x2a90 << 0x20) + (uVar17 & 0xffffffff) * 0x2a90 + auVar23._8_8_;
      lVar10 = lVar10 + 2;
      uVar15 = uVar15 + 2;
      uVar17 = uVar17 + 2;
    } while (lVar10 != 4);
    break;
  case BLOCK_128X128:
    uVar15 = 0;
    uVar17 = 1;
    lVar16 = 0;
    lVar10 = *plVar8;
    auVar24._8_4_ = (int)lVar10;
    auVar24._0_8_ = lVar10;
    auVar24._12_4_ = (int)((ulong)lVar10 >> 0x20);
    do {
      alStack_60[lVar16] =
           ((uVar15 >> 0x20) * 0xaa90 << 0x20) + (uVar15 & 0xffffffff) * 0xaa90 + lVar10;
      alStack_60[lVar16 + 1] =
           ((uVar17 >> 0x20) * 0xaa90 << 0x20) + (uVar17 & 0xffffffff) * 0xaa90 + auVar24._8_8_;
      lVar16 = lVar16 + 2;
      uVar15 = uVar15 + 2;
      uVar17 = uVar17 + 2;
    } while (lVar16 != 4);
    break;
  default:
    if (bsize != BLOCK_8X8) goto switchD_0024f06b_caseD_7;
    uVar15 = 0;
    uVar17 = 1;
    lVar10 = 0;
    auVar22._8_4_ = uVar20;
    auVar22._0_8_ = plVar8;
    auVar22._12_4_ = uVar26;
    do {
      alStack_60[lVar10] =
           (long)plVar8 + ((uVar15 >> 0x20) * 0x90 << 0x20) + (uVar15 & 0xffffffff) * 0x90;
      alStack_60[lVar10 + 1] =
           ((uVar17 >> 0x20) * 0x90 << 0x20) + (uVar17 & 0xffffffff) * 0x90 + auVar22._8_8_;
      lVar10 = lVar10 + 2;
      uVar15 = uVar15 + 2;
      uVar17 = uVar17 + 2;
    } while (lVar10 != 4);
  }
  iVar13 = uVar11 + mi_col;
  iVar7 = tile->mi_col_end;
  if (((iVar13 <= iVar7) && (force_split == '\x02')) && ((int)(uVar6 + mi_row) <= tile->mi_row_end))
  {
LAB_0024f346:
    if ((cpi->common).mi_params.mi_cols <= mi_col) {
      return 1;
    }
    if ((cpi->common).mi_params.mi_rows <= mi_row) {
      return 1;
    }
    iVar7 = (mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [(cpi->common).mi_params.mi_alloc_bsize]) *
            (cpi->common).mi_params.mi_alloc_stride +
            mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    pMVar5 = (cpi->common).mi_params.mi_alloc;
    (cpi->common).mi_params.mi_grid_base[(cpi->common).mi_params.mi_stride * mi_row + mi_col] =
         pMVar5 + iVar7;
    pMVar5[iVar7].bsize = bsize;
    return 1;
  }
  uVar11 = 0;
  if (force_split == '\x01') {
    return 0;
  }
  if (bsize == bsize_min) {
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      bVar1 = *(byte *)((long)data + 8) & 0x1f;
      *(uint *)((long)data + 0xc) =
           (uint)((*data - (int)((ulong)((long)*(int *)((long)data + 4) *
                                        (long)*(int *)((long)data + 4)) >>
                                (*(byte *)((long)data + 8) & 0x3f))) * 0x100) >> bVar1;
      uVar11 = 0 >> bVar1;
    }
    if (iVar7 < iVar13) {
      return uVar11;
    }
    if (tile->mi_row_end < (int)(uVar6 + mi_row)) {
      return uVar11;
    }
    if (threshold <= *(int *)((long)data + 0xc)) {
      return uVar11;
    }
    goto LAB_0024f346;
  }
  if (bsize <= bsize_min) {
    return 0;
  }
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    *(uint *)((long)data + 0xc) =
         (uint)((*data - (int)((ulong)((long)*(int *)((long)data + 4) *
                                      (long)*(int *)((long)data + 4)) >>
                              (*(byte *)((long)data + 8) & 0x3f))) * 0x100) >>
         (*(byte *)((long)data + 8) & 0x1f);
    if (bsize < BLOCK_32X64) {
      if (threshold * 0x10 < (long)*(int *)((long)data + 0xc)) {
        return 0;
      }
      goto LAB_0024f3dc;
    }
LAB_0024f623:
    iVar7 = 0;
  }
  else {
LAB_0024f3dc:
    if (((iVar7 < iVar13) || (tile->mi_row_end < (int)(uVar6 + mi_row))) ||
       (threshold <= *(int *)((long)data + 0xc))) {
      iVar4 = tile->mi_row_end;
      if (((int)(uVar6 + mi_row) <= iVar4) && ((int)(uVar9 + mi_col) <= iVar7)) {
        local_38 = (ulong)(uint)mi_row;
        bsize_00 = get_partition_subsize(bsize,'\x02');
        mi_row = (int)local_38;
        local_40 = (ulong)bsize_00;
        BVar3 = av1_ss_size_lookup[local_40][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y]
        ;
        uVar11 = (uint)((*(int *)((long)data + 0x30) -
                        (int)((ulong)((long)*(int *)((long)data + 0x34) *
                                     (long)*(int *)((long)data + 0x34)) >>
                             (*(byte *)((long)data + 0x38) & 0x3f))) * 0x100) >>
                 (*(byte *)((long)data + 0x38) & 0x1f);
        *(uint *)((long)data + 0x3c) = uVar11;
        *(uint *)((long)data + 0x4c) =
             (uint)((*(int *)((long)data + 0x40) -
                    (int)((ulong)((long)*(int *)((long)data + 0x44) *
                                 (long)*(int *)((long)data + 0x44)) >>
                         (*(byte *)((long)data + 0x48) & 0x3f))) * 0x100) >>
             (*(byte *)((long)data + 0x48) & 0x1f);
        if (((int)uVar11 < threshold) &&
           ((*(int *)((long)data + 0x4c) < threshold && (BVar3 != BLOCK_INVALID)))) {
          set_block_size(cpi,mi_row,mi_col,bsize_00);
          mi_col = uVar12 + mi_col;
          bsize = bsize_00;
          goto LAB_0024f5ec;
        }
      }
      if (iVar7 < iVar13) {
        return 0;
      }
      if (iVar4 < (int)(local_78 + mi_row)) {
        return 0;
      }
      bsize = get_partition_subsize(bsize,'\x01');
      BVar3 = av1_ss_size_lookup[bsize][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y];
      uVar11 = (uint)((*(int *)((long)data + 0x10) -
                      (int)((ulong)((long)*(int *)((long)data + 0x14) *
                                   (long)*(int *)((long)data + 0x14)) >>
                           (*(byte *)((long)data + 0x18) & 0x3f))) * 0x100) >>
               (*(byte *)((long)data + 0x18) & 0x1f);
      *(uint *)((long)data + 0x1c) = uVar11;
      *(uint *)((long)data + 0x2c) =
           (uint)((*(int *)((long)data + 0x20) -
                  (int)((ulong)((long)*(int *)((long)data + 0x24) *
                               (long)*(int *)((long)data + 0x24)) >>
                       (*(byte *)((long)data + 0x28) & 0x3f))) * 0x100) >>
           (*(byte *)((long)data + 0x28) & 0x1f);
      if (threshold <= (int)uVar11) goto LAB_0024f623;
      if (threshold <= *(int *)((long)data + 0x2c)) {
        return 0;
      }
      if (BVar3 == BLOCK_INVALID) {
        return 0;
      }
      set_block_size(cpi,mi_row,mi_col,bsize);
      mi_row = uVar14 + mi_row;
    }
LAB_0024f5ec:
    set_block_size(cpi,mi_row,mi_col,bsize);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int set_vt_partitioning(AV1_COMP *cpi, MACROBLOCKD *const xd,
                               const TileInfo *const tile, void *data,
                               BLOCK_SIZE bsize, int mi_row, int mi_col,
                               int64_t threshold, BLOCK_SIZE bsize_min,
                               PART_EVAL_STATUS force_split) {
  AV1_COMMON *const cm = &cpi->common;
  variance_node vt;
  const int block_width = mi_size_wide[bsize];
  const int block_height = mi_size_high[bsize];
  int bs_width_check = block_width;
  int bs_height_check = block_height;
  int bs_width_vert_check = block_width >> 1;
  int bs_height_horiz_check = block_height >> 1;
  // On the right and bottom boundary we only need to check
  // if half the bsize fits, because boundary is extended
  // up to 64. So do this check only for sb_size = 64X64.
  if (cm->seq_params->sb_size == BLOCK_64X64) {
    if (tile->mi_col_end == cm->mi_params.mi_cols) {
      bs_width_check = (block_width >> 1) + 1;
      bs_width_vert_check = (block_width >> 2) + 1;
    }
    if (tile->mi_row_end == cm->mi_params.mi_rows) {
      bs_height_check = (block_height >> 1) + 1;
      bs_height_horiz_check = (block_height >> 2) + 1;
    }
  }

  assert(block_height == block_width);
  tree_to_node(data, bsize, &vt);

  if (mi_col + bs_width_check <= tile->mi_col_end &&
      mi_row + bs_height_check <= tile->mi_row_end &&
      force_split == PART_EVAL_ONLY_NONE) {
    set_block_size(cpi, mi_row, mi_col, bsize);
    return 1;
  }
  if (force_split == PART_EVAL_ONLY_SPLIT) return 0;

  // For bsize=bsize_min (16x16/8x8 for 8x8/4x4 downsampling), select if
  // variance is below threshold, otherwise split will be selected.
  // No check for vert/horiz split as too few samples for variance.
  if (bsize == bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    return 0;
  } else if (bsize > bsize_min) {
    // Variance already computed to set the force_split.
    if (frame_is_intra_only(cm)) get_variance(&vt.part_variances->none);
    // For key frame: take split for bsize above 32X32 or very high variance.
    if (frame_is_intra_only(cm) &&
        (bsize > BLOCK_32X32 ||
         vt.part_variances->none.variance > (threshold << 4))) {
      return 0;
    }
    // If variance is low, take the bsize (no split).
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_check <= tile->mi_row_end &&
        vt.part_variances->none.variance < threshold) {
      set_block_size(cpi, mi_row, mi_col, bsize);
      return 1;
    }
    // Check vertical split.
    if (mi_row + bs_height_check <= tile->mi_row_end &&
        mi_col + bs_width_vert_check <= tile->mi_col_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_VERT);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->vert[0]);
      get_variance(&vt.part_variances->vert[1]);
      if (vt.part_variances->vert[0].variance < threshold &&
          vt.part_variances->vert[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row, mi_col + block_width / 2, subsize);
        return 1;
      }
    }
    // Check horizontal split.
    if (mi_col + bs_width_check <= tile->mi_col_end &&
        mi_row + bs_height_horiz_check <= tile->mi_row_end) {
      BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
      BLOCK_SIZE plane_bsize =
          get_plane_block_size(subsize, xd->plane[AOM_PLANE_U].subsampling_x,
                               xd->plane[AOM_PLANE_U].subsampling_y);
      get_variance(&vt.part_variances->horz[0]);
      get_variance(&vt.part_variances->horz[1]);
      if (vt.part_variances->horz[0].variance < threshold &&
          vt.part_variances->horz[1].variance < threshold &&
          plane_bsize < BLOCK_INVALID) {
        set_block_size(cpi, mi_row, mi_col, subsize);
        set_block_size(cpi, mi_row + block_height / 2, mi_col, subsize);
        return 1;
      }
    }
    return 0;
  }
  return 0;
}